

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_interp.c
# Opt level: O0

sunrealtype LBasisD2(ARKInterp I,int j,sunrealtype t)

{
  sunrealtype r;
  sunrealtype q;
  sunrealtype p;
  int l;
  int k;
  int i;
  sunrealtype t_local;
  int j_local;
  ARKInterp I_local;
  
  p = 0.0;
  for (l = 0; l < *(int *)((long)I->content + 0x18); l = l + 1) {
    if (l != j) {
      q = 0.0;
      for (i = 0; i < *(int *)((long)I->content + 0x18); i = i + 1) {
        if ((i != j) && (i != l)) {
          r = 1.0;
          for (k = 0; k < *(int *)((long)I->content + 0x18); k = k + 1) {
            if (((k != j) && (k != i)) && (k != l)) {
              r = ((t - *(double *)(*(long *)((long)I->content + 0x10) + (long)k * 8)) /
                  (*(double *)(*(long *)((long)I->content + 0x10) + (long)j * 8) -
                  *(double *)(*(long *)((long)I->content + 0x10) + (long)k * 8))) * r;
            }
          }
          q = r / (*(double *)(*(long *)((long)I->content + 0x10) + (long)j * 8) -
                  *(double *)(*(long *)((long)I->content + 0x10) + (long)i * 8)) + q;
        }
      }
      p = q / (*(double *)(*(long *)((long)I->content + 0x10) + (long)j * 8) -
              *(double *)(*(long *)((long)I->content + 0x10) + (long)l * 8)) + p;
    }
  }
  return p;
}

Assistant:

sunrealtype LBasisD2(ARKInterp I, int j, sunrealtype t)
{
  int i, k, l;
  sunrealtype p, q, r;
  p = ZERO;
  for (l = 0; l < LINT_NHIST(I); l++)
  {
    if (l == j) { continue; }
    q = ZERO;
    for (i = 0; i < LINT_NHIST(I); i++)
    {
      if (i == j) { continue; }
      if (i == l) { continue; }
      r = ONE;
      for (k = 0; k < LINT_NHIST(I); k++)
      {
        if (k == j) { continue; }
        if (k == i) { continue; }
        if (k == l) { continue; }
        r *= (t - LINT_TJ(I, k)) / (LINT_TJ(I, j) - LINT_TJ(I, k));
      }
      q += r / (LINT_TJ(I, j) - LINT_TJ(I, i));
    }
    p += q / (LINT_TJ(I, j) - LINT_TJ(I, l));
  }

  return (p);
}